

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties_test.cpp
# Opt level: O0

void __thiscall
Properties_MingapAfterTransformations_Test::TestBody
          (Properties_MingapAfterTransformations_Test *this)

{
  double dVar1;
  bool bVar2;
  char *message;
  AssertHelper local_108;
  Message local_100;
  undefined1 local_f8 [8];
  AssertionResult gtest_ar;
  double dStack_e0;
  float distance;
  double local_d8;
  double local_d0;
  vec<double,_3> local_c8;
  double local_b0;
  double local_a8;
  double local_a0;
  vec<double,_3> local_98;
  Manifold local_80 [16];
  Manifold local_70 [16];
  Manifold local_60 [16];
  Manifold local_50 [8];
  Manifold b;
  Manifold local_30 [16];
  Manifold local_20 [8];
  Manifold a;
  Properties_MingapAfterTransformations_Test *this_local;
  
  manifold::Manifold::Sphere(1.0,(int)local_30);
  manifold::Manifold::Rotate(30.0,30.0,30.0);
  manifold::Manifold::~Manifold(local_30);
  manifold::Manifold::Sphere(1.0,(int)local_80);
  local_a0 = 3.0;
  local_a8 = 1.0;
  local_b0 = 1.0;
  linalg::vec<double,_3>::vec(&local_98,&local_a0,&local_a8,&local_b0);
  manifold::Manifold::Scale(local_70,local_80);
  manifold::Manifold::Rotate(0.0,90.0,45.0);
  local_d0 = 3.0;
  local_d8 = 0.0;
  dStack_e0 = 0.0;
  linalg::vec<double,_3>::vec(&local_c8,&local_d0,&local_d8,&stack0xffffffffffffff20);
  manifold::Manifold::Translate(local_50,local_60);
  manifold::Manifold::~Manifold(local_60);
  manifold::Manifold::~Manifold(local_70);
  manifold::Manifold::~Manifold(local_80);
  dVar1 = (double)manifold::Manifold::MinGap(local_20,1.1);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ = (float)dVar1;
  testing::internal::DoubleNearPredFormat
            ((internal *)local_f8,"distance","1","0.001",
             (double)gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl._4_4_,1.0,0.001);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
  if (!bVar2) {
    testing::Message::Message(&local_100);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_f8);
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/elalish[P]manifold/test/properties_test.cpp"
               ,0xca,message);
    testing::internal::AssertHelper::operator=(&local_108,&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    testing::Message::~Message(&local_100);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
  manifold::Manifold::~Manifold(local_50);
  manifold::Manifold::~Manifold(local_20);
  return;
}

Assistant:

TEST(Properties, MingapAfterTransformations) {
  auto a = Manifold::Sphere(1, 512).Rotate(30, 30, 30);
  auto b =
      Manifold::Sphere(1, 512).Scale({3, 1, 1}).Rotate(0, 90, 45).Translate(
          {3, 0, 0});

  float distance = a.MinGap(b, 1.1);

  ASSERT_NEAR(distance, 1, 0.001);
}